

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

QuantaResult * __thiscall
NEST::NESTcalc::GetQuanta
          (QuantaResult *__return_storage_ptr__,NESTcalc *this,YieldResult *yields,double density,
          vector<double,_std::allocator<double>_> *NRERWidthsParam,double SkewnessER)

{
  vector<double,_std::allocator<double>_> *density_00;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  runtime_error *prVar4;
  double *pdVar5;
  int64_t iVar6;
  const_reference pvVar7;
  RandomGen *pRVar8;
  NESTcalc *pNVar9;
  double extraout_XMM0_Qa;
  double dVar10;
  double dVar11;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar12;
  double dVar13;
  double dVar14;
  double extraout_XMM0_Qa_02;
  double dVar15;
  double dVar16;
  double dVar17;
  Wvalue WVar18;
  double local_1a8;
  double muCorrection;
  double widthCorrection;
  double F1;
  double F0;
  double E3;
  double E2;
  double E1;
  double E0;
  double cc1;
  double cc0;
  double alpha0;
  double fld;
  double engy;
  double Wq_eV;
  Wvalue wvalue;
  double skewness;
  double Variance;
  double omega;
  double local_b0;
  double local_a8;
  double Fano_1;
  double Fano;
  double recombProb;
  double alf;
  double local_80;
  double local_78;
  double local_70;
  double elecFrac;
  double Nq_mean;
  double excitonRatio;
  int local_48;
  int local_44;
  int Nex;
  int Ni;
  int Nph;
  int Ne;
  int Nq_actual;
  bool HighE;
  double SkewnessER_local;
  vector<double,_std::allocator<double>_> *NRERWidthsParam_local;
  double density_local;
  YieldResult *yields_local;
  NESTcalc *this_local;
  
  _Nq_actual = SkewnessER;
  SkewnessER_local = (double)NRERWidthsParam;
  NRERWidthsParam_local = (vector<double,_std::allocator<double>_> *)density;
  density_local = (double)yields;
  yields_local = (YieldResult *)this;
  memset(__return_storage_ptr__,0,0x20);
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)SkewnessER_local);
  if (sVar3 < 0xb) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"ERROR: You need a minimum of 11 free parameters for the resolution model.");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Nq_mean = *(double *)((long)density_local + 0x10);
  elecFrac = *(double *)density_local + *(double *)((long)density_local + 8);
  local_78 = 0.0;
  local_80 = *(double *)((long)density_local + 8) / elecFrac;
  alf = 1.0;
  pdVar5 = std::min<double>(&local_80,&alf);
  pdVar5 = std::max<double>(&local_78,pdVar5);
  local_70 = *pdVar5;
  Ne._3_1_ = Nq_mean < 0.0;
  if ((bool)Ne._3_1_) {
    Nq_mean = 0.0;
  }
  recombProb = 1.0 / (Nq_mean + 1.0);
  Fano = -(Nq_mean + 1.0) * local_70 + 1.0;
  if (Fano < 0.0) {
    Nq_mean = 1.0 / local_70 - 1.0;
  }
  bVar1 = ValidityTests::nearlyEqual(*(double *)((long)density_local + 0x18),1.0,1e-09);
  if (bVar1) {
    bVar1 = ValidityTests::nearlyEqual(elecFrac,0.0,1e-09);
    if (bVar1) {
      Nph = 0;
    }
    else {
      (*this->_vptr_NESTcalc[0xf])
                (NRERWidthsParam_local,elecFrac,*(undefined8 *)((long)density_local + 0x20),this,
                 SkewnessER_local);
      Fano_1 = extraout_XMM0_Qa;
      pRVar8 = RandomGen::rndm();
      dVar10 = elecFrac;
      dVar11 = sqrt(Fano_1 * elecFrac);
      dVar10 = RandomGen::rand_gauss(pRVar8,dVar10,dVar11,true);
      dVar10 = floor(dVar10 + 0.5);
      Nph = (int)dVar10;
    }
    pRVar8 = RandomGen::rndm();
    iVar6 = RandomGen::binom_draw(pRVar8,(long)Nph,recombProb);
    local_44 = (int)iVar6;
    local_48 = Nph - local_44;
  }
  else {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)SkewnessER_local,0);
    local_a8 = *pvVar7;
    pRVar8 = RandomGen::rndm();
    dVar10 = elecFrac * recombProb;
    dVar11 = sqrt(local_a8 * elecFrac * recombProb);
    dVar10 = RandomGen::rand_gauss(pRVar8,dVar10,dVar11,true);
    dVar10 = floor(dVar10 + 0.5);
    local_44 = (int)dVar10;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)SkewnessER_local,1);
    local_a8 = *pvVar7;
    pRVar8 = RandomGen::rndm();
    dVar10 = elecFrac * Nq_mean * recombProb;
    dVar11 = sqrt(local_a8 * elecFrac * Nq_mean * recombProb);
    dVar10 = RandomGen::rand_gauss(pRVar8,dVar10,dVar11,true);
    dVar10 = floor(dVar10 + 0.5);
    local_48 = (int)dVar10;
    Nph = local_48 + local_44;
  }
  if (Nph == 0) {
    __return_storage_ptr__->ions = 0;
    __return_storage_ptr__->excitons = 0;
    __return_storage_ptr__->photons = 0;
    __return_storage_ptr__->electrons = 0;
    __return_storage_ptr__->Variance = 0.0;
    __return_storage_ptr__->recombProb = 0.0;
  }
  else {
    if (local_48 < 0) {
      local_48 = 0;
    }
    if (local_44 < 0) {
      local_44 = 0;
    }
    if (Nph < local_48) {
      local_48 = Nph;
    }
    if (Nph < local_44) {
      local_44 = Nph;
    }
    __return_storage_ptr__->ions = local_44;
    __return_storage_ptr__->excitons = local_48;
    if ((local_48 < 1) && ((Ne._3_1_ & 1) != 0)) {
      Fano = *(double *)density_local / (double)local_44;
    }
    local_b0 = 0.0;
    omega = 1.0;
    pdVar5 = std::min<double>(&Fano,&omega);
    pdVar5 = std::max<double>(&local_b0,pdVar5);
    Fano = *pdVar5;
    uVar2 = std::isnan(Fano);
    if (((((uVar2 & 1) != 0) || (uVar2 = std::isnan(local_70), (uVar2 & 1) != 0)) || (local_44 == 0)
        ) || (bVar1 = ValidityTests::nearlyEqual(Fano,0.0,1e-09), bVar1)) {
      __return_storage_ptr__->photons = local_48;
      __return_storage_ptr__->electrons = local_44;
      __return_storage_ptr__->recombProb = 0.0;
      __return_storage_ptr__->Variance = 0.0;
    }
    else {
      if (1.0 < *(double *)((long)density_local + 0x18) ||
          *(double *)((long)density_local + 0x18) == 1.0) {
        pNVar9 = this;
        (*this->_vptr_NESTcalc[0xe])(*(undefined8 *)((long)density_local + 0x20),local_70);
        uVar2 = (uint)pNVar9;
        local_1a8 = extraout_XMM0_Qa_01;
      }
      else {
        pNVar9 = this;
        (*this->_vptr_NESTcalc[0xd])(local_70);
        uVar2 = (uint)pNVar9;
        local_1a8 = extraout_XMM0_Qa_00;
      }
      Variance = local_1a8;
      bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
      density_00 = NRERWidthsParam_local;
      if (bVar1) {
        Variance = 0.0;
      }
      dVar10 = Fano * (1.0 - Fano) * (double)local_44 +
               Variance * Variance * (double)local_44 * (double)local_44;
      if (((10000.0 < *(double *)density_local + *(double *)((long)density_local + 8)) ||
          (4000.0 < *(double *)((long)density_local + 0x20))) ||
         (*(double *)((long)density_local + 0x20) <= 50.0 &&
          *(double *)((long)density_local + 0x20) != 50.0)) {
        wvalue.alpha = 0.0;
      }
      else {
        dVar11 = VDetector::get_molarMass(this->fdetector);
        bVar1 = VDetector::get_OldW13eV(this->fdetector);
        uVar2 = (uint)bVar1;
        WVar18 = WorkFunction((double)density_00,dVar11,bVar1);
        Wq_eV = WVar18.Wq_eV;
        dVar13 = Wq_eV * 0.001 * (*(double *)density_local + *(double *)((long)density_local + 8));
        dVar11 = *(double *)((long)density_local + 0x20);
        bVar1 = ValidityTests::nearlyEqual(*(double *)((long)density_local + 0x18),1.0,1e-09);
        if (bVar1) {
          if ((_Nq_actual != -999.0) || (NAN(_Nq_actual))) {
            wvalue.alpha = _Nq_actual;
          }
          else {
            dVar14 = exp((dVar13 - 26.7) / 6.4);
            dVar15 = exp((dVar11 * -1.0) / 225.0);
            dVar16 = exp((dVar13 * -1.0) / 7.7);
            dVar17 = exp(((dVar13 - 26.7) * -1.0) / 6.4);
            dVar13 = exp((dVar13 * -1.0) / 54.0);
            dVar11 = sqrt(dVar11);
            dVar12 = sqrt(71.0);
            dVar11 = exp((dVar11 * -1.0) / dVar12);
            wvalue.alpha = (1.0 / (dVar14 + 1.0)) * (dVar15 * 4.0 * (1.0 - dVar16) + 1.39) +
                           (1.0 / (dVar17 + 1.0)) * 22.1 * dVar13 * dVar11;
          }
        }
        else {
          dVar11 = SkewnessER_local;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)SkewnessER_local,5);
          uVar2 = SUB84(dVar11,0);
          wvalue.alpha = *pvVar7;
        }
      }
      dVar11 = sqrt(1.0 - (wvalue.alpha * 0.6366197723675814 * wvalue.alpha) /
                          (wvalue.alpha * wvalue.alpha + 1.0));
      dVar13 = sqrt(dVar10);
      dVar14 = sqrt(wvalue.alpha * wvalue.alpha + 1.0);
      std::abs(uVar2);
      if ((extraout_XMM0_Qa_02 <= 2.2250738585072014e-308) ||
         (bVar1 = ValidityTests::nearlyEqual(54.0,54.0,1e-09), !bVar1)) {
        pRVar8 = RandomGen::rndm();
        dVar11 = 1.0 - Fano;
        dVar14 = (double)local_44;
        dVar13 = sqrt(dVar10);
        dVar11 = RandomGen::rand_gauss(pRVar8,dVar11 * dVar14,dVar13,true);
        dVar11 = floor(dVar11 + 0.5);
      }
      else {
        pRVar8 = RandomGen::rndm();
        dVar15 = 1.0 - Fano;
        dVar17 = (double)local_44;
        dVar16 = sqrt(dVar10);
        dVar11 = RandomGen::rand_skewGauss
                           (pRVar8,dVar15 * dVar17 +
                                   -((dVar13 / dVar11) * (wvalue.alpha / dVar14) * 2.0 *
                                    0.39894228040143265),dVar16 / dVar11,wvalue.alpha);
        dVar11 = floor(dVar11 + 0.5);
      }
      Ni = (int)dVar11;
      Ni = clamp(Ni,0,local_44);
      Nex = Nph - Ni;
      if (Nph < Nex) {
        Nex = Nph;
      }
      if (Nex < local_48) {
        Nex = local_48;
      }
      if (Nex + Ni != local_48 + local_44) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar4,"ERROR: Quanta not conserved. Tell Matthew Immediately!");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      __return_storage_ptr__->Variance = dVar10;
      __return_storage_ptr__->recombProb = Fano;
      __return_storage_ptr__->photons = Nex;
      __return_storage_ptr__->electrons = Ni;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QuantaResult NESTcalc::GetQuanta(const YieldResult &yields, double density,
                                 const std::vector<double> &NRERWidthsParam,
                                 double SkewnessER) {
  QuantaResult result{};
  bool HighE;
  int Nq_actual, Ne, Nph, Ni, Nex;

  if (NRERWidthsParam.size() < 11) {
    throw std::runtime_error(
        "ERROR: You need a minimum of 11 free parameters for the resolution "
        "model.");
  }

  double excitonRatio = yields.ExcitonRatio;
  double Nq_mean = yields.PhotonYield + yields.ElectronYield;

  double elecFrac = max(0., min(yields.ElectronYield / Nq_mean, 1.));

  if (excitonRatio < 0.) {
    excitonRatio = 0.;
    HighE = true;
  } else {
    HighE = false;
  }

  double alf = 1. / (1. + excitonRatio);
  double recombProb = 1. - (excitonRatio + 1.) * elecFrac;
  if (recombProb < 0.) {
    excitonRatio = 1. / elecFrac - 1.;
  }

  if (ValidityTests::nearlyEqual(yields.Lindhard, 1.)) {
    if (ValidityTests::nearlyEqual(Nq_mean, 0.))
      Nq_actual = 0;
    else {
      double Fano =
          FanoER(density, Nq_mean, yields.ElectricField, NRERWidthsParam);
      Nq_actual = int(floor(
          RandomGen::rndm()->rand_gauss(Nq_mean, sqrt(Fano * Nq_mean), true) +
          0.5));
    }

    Ni = RandomGen::rndm()->binom_draw(Nq_actual, alf);
    Nex = Nq_actual - Ni;

  } else {
    double Fano = NRERWidthsParam[0];
    Ni = int(floor(RandomGen::rndm()->rand_gauss(
                       Nq_mean * alf, sqrt(Fano * Nq_mean * alf), true) +
                   0.5));
    Fano = NRERWidthsParam[1];
    Nex = int(floor(RandomGen::rndm()->rand_gauss(
                        Nq_mean * excitonRatio * alf,
                        sqrt(Fano * Nq_mean * excitonRatio * alf), true) +
                    0.5));
    Nq_actual = Nex + Ni;
  }

  if (Nq_actual == 0) {
    result.ions = 0;
    result.excitons = 0;
    result.photons = 0;
    result.electrons = 0;
    result.Variance = 0;
    result.recombProb = 0;
    return result;
  }

  if (Nex < 0) Nex = 0;
  if (Ni < 0) Ni = 0;
  if (Nex > Nq_actual) Nex = Nq_actual;
  if (Ni > Nq_actual) Ni = Nq_actual;

  result.ions = Ni;
  result.excitons = Nex;

  if (Nex <= 0 && HighE) recombProb = yields.PhotonYield / double(Ni);
  recombProb = max(0., min(recombProb, 1.));
  if (std::isnan(recombProb) || std::isnan(elecFrac) || Ni == 0 ||
      ValidityTests::nearlyEqual(recombProb, 0.0)) {
    result.photons = Nex;
    result.electrons = Ni;
    elecFrac = 1.0;
    result.recombProb = 0.;
    result.Variance = 0.;
    return result;
  }

  // set omega (non-binomial recombination fluctuations parameter) according to
  // whether the Lindhard <1, i.e. this is NR.
  double omega = yields.Lindhard < 1
                     ? RecombOmegaNR(elecFrac, NRERWidthsParam)
                     : RecombOmegaER(yields.ElectricField, elecFrac,
                                     NRERWidthsParam);
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.))
    omega = 0.0;  // Ar has no non-binom sauce
  double Variance =
      recombProb * (1. - recombProb) * Ni + omega * omega * Ni * Ni;
  // if ( !fdetector->get_OldW13eV() ) Variance /= sqrt ( ZurichEXOQ );

  double skewness;
  if ((yields.PhotonYield + yields.ElectronYield) > 1e4 ||
      yields.ElectricField > 4e3 || yields.ElectricField < 50.) {
    skewness = 0.00;  // make it a constant 0 when outside the range of Vetri
                      // Velan's Run04 models.
  } else {
    // LUX Skewness Model
    Wvalue wvalue = WorkFunction(density, fdetector->get_molarMass(),
                                 fdetector->get_OldW13eV());
    double Wq_eV = wvalue.Wq_eV;
    double engy = 1e-3 * Wq_eV * (yields.PhotonYield + yields.ElectronYield);
    double fld = yields.ElectricField;

    double alpha0 = 1.39;
    double cc0 = 4.0, cc1 = 22.1;
    double E0 = 7.7, E1 = 54., E2 = 26.7, E3 = 6.4;
    double F0 = 225., F1 = 71.;

    skewness = 0.;

    if (ValidityTests::nearlyEqual(yields.Lindhard, 1.)) {
      if (SkewnessER != -999.) {
        skewness = SkewnessER;
      } else {
        skewness = 1. / (1. + exp((engy - E2) / E3)) *
                       (alpha0 + cc0 * exp(-1. * fld / F0) *
                                     (1. - exp(-1. * engy / E0))) +
                   1. / (1. + exp(-1. * (engy - E2) / E3)) * cc1 *
                       exp(-1. * engy / E1) * exp(-1. * sqrt(fld) / sqrt(F1));
      }

      // if ( std::abs(skewness) <= DBL_MIN ) skewness = DBL_MIN;
    } else {
      skewness = NRERWidthsParam[5];  // 2.25 but ~5-20 also good (for NR). All
                                      // better than zero, but 0 is OK too
    }  // note to self: find way to make 0 for ion (wall BG) incl. alphas?
  }

  double widthCorrection =
      sqrt(1. - (2. / M_PI) * skewness * skewness / (1. + skewness * skewness));
  double muCorrection = (sqrt(Variance) / widthCorrection) *
                        (skewness / sqrt(1. + skewness * skewness)) * 2. *
                        inv_sqrt2_PI;
  if (std::abs(skewness) > DBL_MIN &&
      ValidityTests::nearlyEqual(ATOM_NUM,
                                 54.))  // skewness model only for Xenon!
    Ne = int(floor(RandomGen::rndm()->rand_skewGauss(
                       (1. - recombProb) * Ni - muCorrection,
                       sqrt(Variance) / widthCorrection, skewness) +
                   0.5));
  else {
    Ne = int(floor(RandomGen::rndm()->rand_gauss((1. - recombProb) * Ni,
                                                 sqrt(Variance), true) +
                   0.5));
  }

  Ne = NESTcalc::clamp(Ne, 0, Ni);

  Nph = Nq_actual - Ne;
  if (Nph > Nq_actual) Nph = Nq_actual;
  if (Nph < Nex) Nph = Nex;

  if ((Nph + Ne) != (Nex + Ni)) {
    throw std::runtime_error(
        "ERROR: Quanta not conserved. Tell Matthew Immediately!");
  }

  result.Variance = Variance;
  result.recombProb = recombProb;
  result.photons = Nph;
  result.electrons = Ne;

  return result;  // quanta returned with recomb fluctuations
}